

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastReduceMatrix2(Gia_Man_t *pNew,Vec_Wec_t *vProds,Vec_Int_t *vRes,int fSigned,int fCla)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  int iVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  int NodeC;
  int NodeS;
  int local_70;
  int local_6c;
  ulong local_68;
  ulong local_60;
  Vec_Wec_t *local_58;
  long local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  iVar8 = Wlc_BlastAddLevel(pNew,0);
  iVar1 = vProds->nSize;
  lVar11 = (long)iVar1;
  if (0 < lVar11) {
    lVar12 = 8;
    lVar15 = 0;
    do {
      Wlc_IntSortCostReverse
                (pNew,*(int **)((long)&vProds->pArray->nCap + lVar12),
                 *(int *)((long)vProds->pArray + lVar12 + -4));
      lVar15 = lVar15 + 1;
      lVar12 = lVar12 + 0x10;
    } while (lVar15 < vProds->nSize);
  }
  if (0 < iVar1) {
    lVar12 = 0;
    local_58 = vProds;
    do {
      if (vProds->nSize <= lVar12) goto LAB_008a5dc5;
      local_40 = lVar12 + 1;
      local_50 = lVar12 << 4;
      lVar15 = local_40;
      local_48 = lVar12;
      while( true ) {
        lVar12 = lVar15;
        iVar2 = *(int *)((long)&vProds->pArray->nSize + local_50);
        if (iVar2 < 3) break;
        pVVar9 = (Vec_Int_t *)((long)&vProds->pArray->nCap + local_50);
        piVar10 = pVVar9->pArray;
        pVVar9->nSize = iVar2 - 1U;
        uVar3 = piVar10[iVar2 - 1U];
        pVVar9->nSize = iVar2 - 2U;
        uVar4 = piVar10[iVar2 - 2U];
        pVVar9->nSize = iVar2 - 3U;
        uVar5 = piVar10[iVar2 - 3U];
        if ((int)uVar5 < 0) {
LAB_008a5da6:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar14 = uVar5 >> 1;
        pVVar6 = pNew->vLevels;
        local_68 = (ulong)uVar3;
        local_60 = (ulong)uVar4;
        local_38 = (ulong)uVar5;
        Vec_IntFillExtra(pVVar6,uVar14 + 1,0);
        if (pVVar6->nSize <= (int)uVar14) goto LAB_008a5d87;
        if ((int)local_60 < 0) goto LAB_008a5da6;
        iVar2 = pVVar6->pArray[uVar14];
        uVar13 = local_60 >> 1 & 0x7fffffff;
        pVVar6 = pNew->vLevels;
        iVar7 = (int)uVar13;
        Vec_IntFillExtra(pVVar6,iVar7 + 1,0);
        if (pVVar6->nSize <= iVar7) goto LAB_008a5d87;
        if (iVar2 < pVVar6->pArray[uVar13]) {
          __assert_fail("Gia_ObjLevelId(pNew, Abc_Lit2Var(Node3)) >= Gia_ObjLevelId(pNew, Abc_Lit2Var(Node2))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                        ,0x3d7,
                        "void Wlc_BlastReduceMatrix2(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *, int, int)"
                       );
        }
        pVVar6 = pNew->vLevels;
        Vec_IntFillExtra(pVVar6,iVar7 + 1,0);
        if (pVVar6->nSize <= iVar7) goto LAB_008a5d87;
        if ((int)local_68 < 0) goto LAB_008a5da6;
        iVar2 = pVVar6->pArray[uVar13];
        uVar13 = local_68 >> 1 & 0x7fffffff;
        pVVar6 = pNew->vLevels;
        iVar7 = (int)uVar13;
        Vec_IntFillExtra(pVVar6,iVar7 + 1,0);
        if (pVVar6->nSize <= iVar7) goto LAB_008a5d87;
        if (iVar2 < pVVar6->pArray[uVar13]) {
          __assert_fail("Gia_ObjLevelId(pNew, Abc_Lit2Var(Node2)) >= Gia_ObjLevelId(pNew, Abc_Lit2Var(Node1))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                        ,0x3d8,
                        "void Wlc_BlastReduceMatrix2(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *, int, int)"
                       );
        }
        Wlc_BlastFullAdder(pNew,(int)local_68,(int)local_60,(int)local_38,&local_70,&local_6c);
        iVar8 = Wlc_BlastAddLevel(pNew,iVar8);
        Wlc_IntInsert2(pNew,pVVar9,local_6c);
        lVar15 = local_40;
        vProds = local_58;
        if ((local_58->nSize <= local_40) ||
           (Wlc_IntInsert2(pNew,local_58->pArray + local_40,local_70), vProds->nSize <= local_48))
        goto LAB_008a5dc5;
      }
    } while (lVar12 != lVar11);
  }
  if (0 < iVar1) {
    lVar12 = 0;
    do {
      if (vProds->nSize <= lVar12) goto LAB_008a5dc5;
      iVar8 = vProds->pArray[lVar12].nSize;
      if (iVar8 < 2) {
        pVVar9 = vProds->pArray + lVar12;
        do {
          Vec_IntPush(pVVar9,0);
          iVar8 = pVVar9->nSize;
        } while (iVar8 < 2);
      }
      if (iVar8 != 2) {
        __assert_fail("Vec_IntSize(vProd) == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                      ,0x3ea,
                      "void Wlc_BlastReduceMatrix2(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *, int, int)"
                     );
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar11);
  }
  vRes->nSize = 0;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(400);
  pVVar9->pArray = piVar10;
  if (0 < iVar1) {
    lVar12 = 8;
    lVar15 = 0;
    do {
      if (vProds->nSize <= lVar15) {
LAB_008a5dc5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar6 = vProds->pArray;
      if ((*(int *)((long)pVVar6 + lVar12 + -4) < 1) ||
         (Vec_IntPush(vRes,**(int **)((long)&pVVar6->nCap + lVar12)),
         *(int *)((long)pVVar6 + lVar12 + -4) < 2)) {
LAB_008a5d87:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(pVVar9,*(int *)(*(long *)((long)&pVVar6->nCap + lVar12) + 4));
      lVar15 = lVar15 + 1;
      lVar12 = lVar12 + 0x10;
    } while (lVar11 != lVar15);
  }
  Vec_IntPush(vRes,0);
  Vec_IntPush(pVVar9,0);
  if (fCla == 0) {
    Wlc_BlastAdder(pNew,vRes->pArray,pVVar9->pArray,vRes->nSize,0);
  }
  else {
    Wlc_BlastAdderCLA(pNew,vRes->pArray,pVVar9->pArray,vRes->nSize,fSigned,0);
  }
  if (pVVar9->pArray != (int *)0x0) {
    free(pVVar9->pArray);
    pVVar9->pArray = (int *)0x0;
  }
  free(pVVar9);
  return;
}

Assistant:

void Wlc_BlastReduceMatrix2( Gia_Man_t * pNew, Vec_Wec_t * vProds, Vec_Int_t * vRes, int fSigned, int fCla )
{
    Vec_Int_t * vProd, * vTemp;
    int i, NodeS, NodeC, Node1, Node2, Node3;
    int Start = Wlc_BlastAddLevel( pNew, 0 );
    int nSize = Vec_WecSize(vProds);
    Vec_WecForEachLevel( vProds, vProd, i )
        Wlc_IntSortCostReverse( pNew, Vec_IntArray(vProd), Vec_IntSize(vProd) );
    for ( i = 0; i < nSize; i++ )
    {
        while ( 1 )
        {
            vProd = Vec_WecEntry( vProds, i );
            if ( Vec_IntSize(vProd) < 3 )
                break;

            Node1  = Vec_IntPop( vProd );
            Node2  = Vec_IntPop( vProd );
            Node3  = Vec_IntPop( vProd );

            assert( Gia_ObjLevelId(pNew, Abc_Lit2Var(Node3)) >= Gia_ObjLevelId(pNew, Abc_Lit2Var(Node2)) );
            assert( Gia_ObjLevelId(pNew, Abc_Lit2Var(Node2)) >= Gia_ObjLevelId(pNew, Abc_Lit2Var(Node1)) );

            Wlc_BlastFullAdder( pNew, Node1, Node2, Node3, &NodeC, &NodeS );
            Start = Wlc_BlastAddLevel( pNew, Start );

            Wlc_IntInsert2( pNew, vProd, NodeS );

            vProd  = Vec_WecEntry( vProds, i+1 );
            Wlc_IntInsert2( pNew, vProd, NodeC );
        }
    }

    // make all ranks have two products
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        while ( Vec_IntSize(vProd) < 2 )
            Vec_IntPush( vProd, 0 );
        assert( Vec_IntSize(vProd) == 2 );
    }
//    Vec_WecPrint( vProds, 0 );

    Vec_IntClear( vRes );
    vTemp = Vec_IntAlloc( 100 );
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        Vec_IntPush( vRes,  Vec_IntEntry(vProd, 0) );
        Vec_IntPush( vTemp, Vec_IntEntry(vProd, 1) );
    }
    Vec_IntPush( vRes,  0 );
    Vec_IntPush( vTemp, 0 );

    if ( fCla )
        Wlc_BlastAdderCLA( pNew, Vec_IntArray(vRes), Vec_IntArray(vTemp), Vec_IntSize(vRes), fSigned, 0 );
    else
        Wlc_BlastAdder( pNew, Vec_IntArray(vRes), Vec_IntArray(vTemp), Vec_IntSize(vRes), 0 );
    Vec_IntFree( vTemp );
}